

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cc
# Opt level: O0

bool flow::lang::TokenTraits::isUnaryOp(Token t)

{
  bool local_9;
  Token t_local;
  
  if ((t == Minus) || (t == Not || t == BitNot)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool TokenTraits::isUnaryOp(Token t) {
  // token Plus and Minus can be both, unary and binary
  switch (t) {
    //case Token::Plus:
    case Token::Minus:
    case Token::Not:
    case Token::BitNot:
      return true;
    default:
      return false;
  }
}